

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::ExceptionImport::ExceptionImport(ExceptionImport *this,string_view name)

{
  ExceptionImport *this_local;
  string_view name_local;
  
  ImportMixin<(wabt::ExternalKind)4>::ImportMixin(&this->super_ImportMixin<(wabt::ExternalKind)4>);
  (this->super_ImportMixin<(wabt::ExternalKind)4>).super_Import._vptr_Import =
       (_func_int **)&PTR__ExceptionImport_01e535a8;
  Exception::Exception(&this->except,name);
  return;
}

Assistant:

explicit ExceptionImport(string_view name = string_view())
      : ImportMixin<ExternalKind::Except>(), except(name) {}